

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BGIP_SolverBranchAndBound.h
# Opt level: O0

void __thiscall
BGIP_SolverBranchAndBound<JointPolicyPureVector>::PrintStatistics
          (BGIP_SolverBranchAndBound<JointPolicyPureVector> *this,Index i)

{
  undefined1 auVar1 [16];
  ostream *poVar2;
  size_type sVar3;
  BGIP_SolverBranchAndBound<JointPolicyPureVector> *this_00;
  ostream *this_01;
  uint in_ESI;
  long in_RDI;
  undefined1 auVar5 [16];
  double dVar4;
  undefined1 auVar6 [64];
  stringstream stats;
  Index printNum;
  size_t in_stack_fffffffffffffdd8;
  BGIP_SolverBranchAndBound<JointPolicyPureVector> *in_stack_fffffffffffffde0;
  string local_1d0 [48];
  stringstream local_1a0 [16];
  ostream local_190 [376];
  int local_18;
  int local_14;
  uint local_10;
  uint local_c;
  undefined1 extraout_var [56];
  
  local_10 = 100000;
  local_c = in_ESI;
  if (1 < *(int *)(in_RDI + 0x110)) {
    local_14 = *(int *)(in_RDI + 0x110) + -1;
    local_18 = 5;
    std::min<int>(&local_14,&local_18);
    auVar6._0_8_ = std::pow<int,int>(0,0x156f7d);
    auVar6._8_56_ = extraout_var;
    auVar1 = vcvtusi2sd_avx512f(auVar6._0_16_,local_10);
    auVar5._0_8_ = auVar1._0_8_ / auVar6._0_8_;
    auVar5._8_8_ = auVar1._8_8_;
    local_10 = vcvttsd2usi_avx512f(auVar5);
  }
  if (((-1 < *(int *)(in_RDI + 0x110)) && (local_c % local_10 == 0)) && (local_10 < local_c)) {
    std::__cxx11::stringstream::stringstream(local_1a0);
    poVar2 = (ostream *)std::ostream::operator<<(local_190,local_c);
    poVar2 = std::operator<<(poVar2,"-th node selected for expansion:   ");
    sVar3 = std::
            priority_queue<boost::shared_ptr<BGIP_BnB_Node>,_std::vector<boost::shared_ptr<BGIP_BnB_Node>,_std::allocator<boost::shared_ptr<BGIP_BnB_Node>_>_>,_std::less<boost::shared_ptr<BGIP_BnB_Node>_>_>
            ::size((priority_queue<boost::shared_ptr<BGIP_BnB_Node>,_std::vector<boost::shared_ptr<BGIP_BnB_Node>,_std::allocator<boost::shared_ptr<BGIP_BnB_Node>_>_>,_std::less<boost::shared_ptr<BGIP_BnB_Node>_>_>
                    *)0x157033);
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,sVar3);
    poVar2 = std::operator<<(poVar2," nodes in queue ( ");
    std::
    priority_queue<boost::shared_ptr<BGIP_BnB_Node>,_std::vector<boost::shared_ptr<BGIP_BnB_Node>,_std::allocator<boost::shared_ptr<BGIP_BnB_Node>_>_>,_std::less<boost::shared_ptr<BGIP_BnB_Node>_>_>
    ::size((priority_queue<boost::shared_ptr<BGIP_BnB_Node>,_std::vector<boost::shared_ptr<BGIP_BnB_Node>,_std::allocator<boost::shared_ptr<BGIP_BnB_Node>_>_>,_std::less<boost::shared_ptr<BGIP_BnB_Node>_>_>
            *)0x157073);
    dVar4 = GetPerJPRatio(in_stack_fffffffffffffde0,in_stack_fffffffffffffdd8);
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,dVar4);
    poVar2 = std::operator<<(poVar2," per joint policy), pruned ");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,*(ulong *)(in_RDI + 0x1c8));
    this_00 = (BGIP_SolverBranchAndBound<JointPolicyPureVector> *)
              std::operator<<(poVar2,", full policies ");
    poVar2 = (ostream *)std::ostream::operator<<((ostream *)this_00,*(ulong *)(in_RDI + 0x1d0));
    this_01 = std::operator<<(poVar2,"( ");
    dVar4 = GetPerJPRatio(this_00,(size_t)poVar2);
    poVar2 = (ostream *)std::ostream::operator<<(this_01,dVar4);
    std::operator<<(poVar2," pjp )");
    poVar2 = std::operator<<((ostream *)&std::cout,"BGIP_SolverBranchAndBound ");
    std::__cxx11::stringstream::str();
    poVar2 = std::operator<<(poVar2,local_1d0);
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    std::__cxx11::string::~string(local_1d0);
    std::__cxx11::stringstream::~stringstream(local_1a0);
  }
  return;
}

Assistant:

void PrintStatistics(Index i) const
    {
#define PRINTNUM 100000
        Index printNum = PRINTNUM;
        if(_m_verbosity>1)
        {
            // limit the second argument of pow(), otherwise we get SIGFPE
            printNum /= pow(10,std::min(_m_verbosity-1,5));
        }
        if(_m_verbosity>=0 && i % printNum == 0 && i > printNum) 
        {
            //do not do the printing when not outputting it!
            std::stringstream stats;
            stats << i << "-th node selected for expansion:   "<<_m_openQueue->size() 
                  << " nodes in queue ( "
                  << GetPerJPRatio(_m_openQueue->size())
                  <<" per joint policy), pruned "
                  << _m_nrNodesPruned
                  << ", full policies "
                  << _m_nrNodesFullySpecified
                  << "( " << GetPerJPRatio(_m_nrNodesFullySpecified)
                  << " pjp )";
            std::cout << "BGIP_SolverBranchAndBound " << stats.str() << std::endl;
        }
    }